

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O0

bool __thiscall ShParser::decodeOpcode(ShParser *this,Parser *parser,tShOpcode *opcode)

{
  char cVar1;
  Token *pTVar2;
  string *psVar3;
  Identifier *this_00;
  char *pcVar4;
  string local_68 [8];
  string name;
  Identifier *identifier;
  Token *token;
  size_t pos;
  char *encoding;
  tShOpcode *opcode_local;
  Parser *parser_local;
  ShParser *this_local;
  
  pos = (size_t)opcode->name;
  token = (Token *)0x0;
  ShRegisterData::reset(&this->registers);
  ShImmediateData::reset(&this->immediate);
  ShOpcodeData::reset(&this->opcodeData);
  pTVar2 = Parser::nextToken(parser);
  if (pTVar2->type == Identifier) {
    name.field_2._8_8_ = Token::identifierValue(pTVar2);
    psVar3 = Identifier::string_abi_cxx11_((Identifier *)name.field_2._8_8_);
    std::__cxx11::string::string(local_68,(string *)psVar3);
    do {
      while( true ) {
        if (*(char *)pos == '\0') {
          pTVar2 = (Token *)std::__cxx11::string::size();
          this_local._7_1_ = pTVar2 <= token;
          goto LAB_001e3171;
        }
        if (*(char *)pos != '/') break;
        pTVar2 = (Token *)std::__cxx11::string::size();
        if (token < pTVar2) {
          this_local._7_1_ = false;
          goto LAB_001e3171;
        }
        pTVar2 = Parser::nextToken(parser);
        if (pTVar2->type != Div) {
          this_local._7_1_ = false;
          goto LAB_001e3171;
        }
        pTVar2 = Parser::peekToken(parser,0);
        if (pTVar2->type != Identifier) {
          this_local._7_1_ = false;
          goto LAB_001e3171;
        }
        pTVar2 = Parser::nextToken(parser);
        this_00 = Token::identifierValue(pTVar2);
        psVar3 = Identifier::string_abi_cxx11_(this_00);
        std::__cxx11::string::operator=(local_68,(string *)psVar3);
        token = (Token *)0x0;
        pos = pos + 1;
      }
      pTVar2 = (Token *)std::__cxx11::string::size();
      if (pTVar2 <= token) {
        this_local._7_1_ = false;
        goto LAB_001e3171;
      }
      cVar1 = *(char *)pos;
      token = (Token *)((long)&token->line + 1);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
      pos = pos + 1;
    } while (cVar1 == *pcVar4);
    this_local._7_1_ = false;
LAB_001e3171:
    std::__cxx11::string::~string(local_68);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ShParser::decodeOpcode(Parser& parser, const tShOpcode& opcode)
{
	const char* encoding = opcode.name;
	size_t pos = 0;

	registers.reset();
	immediate.reset();
	opcodeData.reset();

	const Token &token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;
		
	const Identifier &identifier = token.identifierValue();
	std::string name = identifier.string();

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case '/':
			CHECK(pos >= name.size());
			CHECK(parser.nextToken().type == TokenType::Div);
			CHECK(parser.peekToken().type == TokenType::Identifier);
			
			name = parser.nextToken().identifierValue().string();
			pos = 0;
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}